

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

MIPMap * pbrt::ImageTextureBase::GetTexture
                   (string *filename,string *filter,Float maxAniso,WrapMode wrap,
                   ColorEncodingHandle *encoding,Allocator alloc)

{
  bool bVar1;
  iterator this;
  FilterFunction *pFVar2;
  char *in_RCX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  Float in_XMM0_Da;
  unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> mipmap;
  optional<pbrt::FilterFunction> ff;
  MIPMapFilterOptions options;
  unique_lock<std::mutex> lock;
  TexInfo texInfo;
  ColorEncodingHandle *in_stack_000007a8;
  WrapMode in_stack_000007b4;
  MIPMapFilterOptions *in_stack_000007b8;
  string *in_stack_000007c0;
  Allocator in_stack_000007c8;
  map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
  *in_stack_fffffffffffffe88;
  TexInfo *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  key_type *in_stack_fffffffffffffec8;
  TexInfo *in_stack_fffffffffffffed0;
  char *pcVar3;
  int line;
  LogLevel level;
  _Self local_f8;
  _Self local_f0;
  undefined8 local_e8;
  optional local_cc [8];
  MIPMapFilterOptions local_c4;
  undefined4 local_bc;
  _Self local_b8;
  _Self local_b0 [17];
  Float local_24;
  undefined8 local_10;
  pointer local_8;
  
  level = (LogLevel)((ulong)in_RSI >> 0x20);
  pcVar3 = in_RCX;
  local_24 = in_XMM0_Da;
  local_10 = in_R8;
  ColorEncodingHandle::ColorEncodingHandle
            ((ColorEncodingHandle *)in_stack_fffffffffffffe90,
             (ColorEncodingHandle *)in_stack_fffffffffffffe88);
  line = (int)((ulong)pcVar3 >> 0x20);
  TexInfo::TexInfo(in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->filename,
                   (string *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                   (Float)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                   (WrapMode)in_stack_fffffffffffffeb8,
                   (ColorEncodingHandle *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_fffffffffffffe90,
             (mutex_type *)in_stack_fffffffffffffe88);
  this = std::
         map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
         ::find(in_stack_fffffffffffffe88,(key_type *)0xa1944f);
  local_b0[0]._M_node = this._M_node;
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
       ::end(in_stack_fffffffffffffe88);
  bVar1 = std::operator!=(local_b0,&local_b8);
  if (bVar1) {
    std::
    map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
    ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                  *)this._M_node,in_stack_fffffffffffffec8);
    local_8 = std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>::get
                        ((unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *)
                         in_stack_fffffffffffffe90);
    local_bc = 1;
  }
  else {
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffe90);
    MIPMapFilterOptions::MIPMapFilterOptions(&local_c4);
    local_c4.maxAnisotropy = local_24;
    ParseFilter(in_stack_fffffffffffffea8);
    bVar1 = pstd::optional::operator_cast_to_bool(local_cc);
    if (bVar1) {
      pFVar2 = pstd::optional<pbrt::FilterFunction>::operator*
                         ((optional<pbrt::FilterFunction> *)0xa19572);
      local_c4.filter = *pFVar2;
    }
    else {
      Warning<std::__cxx11::string_const&>
                ((char *)CONCAT17(bVar1,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8);
    }
    ColorEncodingHandle::ColorEncodingHandle
              ((ColorEncodingHandle *)in_stack_fffffffffffffe90,
               (ColorEncodingHandle *)in_stack_fffffffffffffe88);
    local_e8 = local_10;
    MIPMap::CreateFromFile
              (in_stack_000007c0,in_stack_000007b8,in_stack_000007b4,in_stack_000007a8,
               in_stack_000007c8);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *)0xa19633);
    if (bVar1) {
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)in_stack_fffffffffffffe90);
      local_f0._M_node =
           (_Base_ptr)
           std::
           map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
           ::find(in_stack_fffffffffffffe88,(key_type *)0xa1965f);
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
           ::end(in_stack_fffffffffffffe88);
      bVar1 = std::operator==(&local_f0,&local_f8);
      if (!bVar1) {
        LogFatal<char_const(&)[49]>(level,in_RDI,line,in_RCX,(char (*) [49])this._M_node);
      }
      std::
      map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
      ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                    *)this._M_node,in_stack_fffffffffffffec8);
      std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>::operator=
                ((unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *)
                 in_stack_fffffffffffffe90,
                 (unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *)
                 in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe90 =
           (TexInfo *)
           std::
           map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
           ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                         *)this._M_node,in_stack_fffffffffffffec8);
      local_8 = std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>::get
                          ((unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *)
                           in_stack_fffffffffffffe90);
    }
    else {
      local_8 = (pointer)0x0;
    }
    local_bc = 1;
    std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>::~unique_ptr
              ((unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *)
               in_stack_fffffffffffffe90);
    pstd::optional<pbrt::FilterFunction>::~optional((optional<pbrt::FilterFunction> *)0xa19784);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffe90);
  TexInfo::~TexInfo(in_stack_fffffffffffffe90);
  return local_8;
}

Assistant:

MIPMap *ImageTextureBase::GetTexture(const std::string &filename,
                                     const std::string &filter, Float maxAniso,
                                     WrapMode wrap, ColorEncodingHandle encoding,
                                     Allocator alloc) {
    // Return _MIPMap_ from texture cache if present
    TexInfo texInfo(filename, filter, maxAniso, wrap, encoding);
    std::unique_lock<std::mutex> lock(textureCacheMutex);
    if (textureCache.find(texInfo) != textureCache.end())
        return textureCache[texInfo].get();
    else
        lock.unlock();

    // Create _MIPMap_ for _filename_
    MIPMapFilterOptions options;
    options.maxAnisotropy = maxAniso;

    pstd::optional<FilterFunction> ff = ParseFilter(filter);
    if (ff)
        options.filter = *ff;
    else
        Warning("%s: filter function unknown", filter);

    std::unique_ptr<MIPMap> mipmap =
        MIPMap::CreateFromFile(filename, options, wrap, encoding, alloc);
    if (mipmap) {
        lock.lock();
        // This is actually ok, but if it hits, it means we've wastefully
        // loaded this texture. (Note that in that case, should just return
        // the one that's already in there and not replace it.)
        CHECK(textureCache.find(texInfo) == textureCache.end());
        textureCache[texInfo] = std::move(mipmap);

        return textureCache[texInfo].get();
    } else
        return nullptr;
}